

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::V0LayerParameter::V0LayerParameter(V0LayerParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__V0LayerParameter_00762380;
  (this->weight_decay_).rep_ = (Rep *)0x0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = 0;
  (this->blobs_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->blobs_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->blobs_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->blobs_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->blobs_lr_).current_size_ = 0;
  (this->blobs_lr_).total_size_ = 0;
  (this->blobs_lr_).rep_ = (Rep *)0x0;
  (this->weight_decay_).current_size_ = 0;
  (this->weight_decay_).total_size_ = 0;
  if (this != (V0LayerParameter *)&_V0LayerParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

V0LayerParameter::V0LayerParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.V0LayerParameter)
}